

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O3

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::DestroyCommandQueues
          (RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           *this)

{
  long lVar1;
  long *plVar2;
  IMemoryAllocator *pIVar3;
  long lVar4;
  CommandQueue *pCVar5;
  ulong uVar6;
  string msg;
  string local_50;
  
  pCVar5 = this->m_CommandQueues;
  if (pCVar5 != (CommandQueue *)0x0) {
    if (this->m_CmdQueueCount != 0) {
      lVar4 = 0x160;
      uVar6 = 0;
      do {
        pCVar5 = this->m_CommandQueues;
        lVar1 = *(long *)((long)&(pCVar5->Mtx).super___mutex_base._M_mutex + lVar4);
        if ((*(long *)((long)pCVar5 + lVar4 + -0x28) - *(long *)((long)pCVar5 + lVar4 + -0x38) >> 4)
            + (*(long *)((long)pCVar5 + lVar4 + -0x18) - *(long *)((long)pCVar5 + lVar4 + -0x10) >>
              4) + ((((ulong)(lVar1 - *(long *)((long)pCVar5 + lVar4 + -0x20)) >> 3) - 1) +
                   (ulong)(lVar1 == 0)) * 0x20 != 0) {
          FormatString<char[71]>
                    (&local_50,
                     (char (*) [71])
                     "All stale resources must be released before destroying a command queue");
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"DestroyCommandQueues",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                     ,0x124);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        lVar1 = *(long *)((long)pCVar5 + lVar4 + -0x98);
        if ((*(long *)((long)pCVar5 + lVar4 + -0xc0) - *(long *)((long)pCVar5 + lVar4 + -0xd0) >> 4)
            + (*(long *)((long)pCVar5 + lVar4 + -0xb0) - *(long *)((long)pCVar5 + lVar4 + -0xa8) >>
              4) + ((((ulong)(lVar1 - *(long *)((long)pCVar5 + lVar4 + -0xb8)) >> 3) - 1) +
                   (ulong)(lVar1 == 0)) * 0x20 != 0) {
          FormatString<char[65]>
                    (&local_50,
                     (char (*) [65])
                     "All resources must be released before destroying a command queue");
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"DestroyCommandQueues",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                     ,0x125);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::~ResourceReleaseQueue
                  ((ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)
                   ((long)pCVar5 + lVar4 + -0x128));
        plVar2 = *(long **)((long)pCVar5 + lVar4 + -0x130);
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 0x10))();
          *(undefined8 *)((long)pCVar5 + lVar4 + -0x130) = 0;
        }
        uVar6 = uVar6 + 1;
        lVar4 = lVar4 + 0x168;
      } while (uVar6 < this->m_CmdQueueCount);
      pCVar5 = this->m_CommandQueues;
    }
    pIVar3 = (this->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_RawMemAllocator;
    (*pIVar3->_vptr_IMemoryAllocator[1])(pIVar3,pCVar5);
    this->m_CommandQueues = (CommandQueue *)0x0;
  }
  return;
}

Assistant:

void DestroyCommandQueues()
    {
        if (m_CommandQueues != nullptr)
        {
            for (size_t q = 0; q < m_CmdQueueCount; ++q)
            {
                auto& Queue = m_CommandQueues[q];
                DEV_CHECK_ERR(Queue.ReleaseQueue.GetStaleResourceCount() == 0, "All stale resources must be released before destroying a command queue");
                DEV_CHECK_ERR(Queue.ReleaseQueue.GetPendingReleaseResourceCount() == 0, "All resources must be released before destroying a command queue");
                Queue.~CommandQueue();
            }
            this->m_RawMemAllocator.Free(m_CommandQueues);
            m_CommandQueues = nullptr;
        }
    }